

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O3

double u_getNumericValue_63(UChar32 c)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  
  if ((uint)c < 0xd800) {
    uVar2 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar2 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar2 = (uint)c >> 5;
    }
  }
  else {
    uVar5 = 0x11f4;
    if (0x10ffff < (uint)c) goto LAB_0015d16a;
    uVar2 = ((uint)c >> 5 & 0x3f) + (uint)propsTrie_index[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar5 = (ulong)((c & 0x1fU) + (uint)propsTrie_index[uVar2] * 4);
LAB_0015d16a:
  uVar1 = propsTrie_index[uVar5];
  if (uVar1 < 0x40) {
    return -123456789.0;
  }
  uVar2 = (uint)(uVar1 >> 6);
  if (uVar1 < 0x2c0) {
    iVar3 = uVar2 - 1;
  }
  else if (uVar1 < 0x540) {
    iVar3 = uVar2 - 0xb;
  }
  else {
    if (0x2bff < uVar1) {
      if (uVar1 < 0x7800) {
        iVar3 = (uVar1 >> 10) - 0xc;
        iVar4 = (uVar2 & 0xf) + 1;
      }
      else {
        if (uVar1 < 0xc000) {
          uVar5 = (ulong)((uVar2 & 0x1f) + 2);
          dVar6 = (double)(int)((uVar1 >> 0xb) - 0xe);
          if (1 < (uVar2 & 0x1f)) {
            do {
              dVar6 = dVar6 * 10000.0;
              uVar2 = (int)uVar5 - 4;
              uVar5 = (ulong)uVar2;
            } while (3 < uVar2);
          }
          dVar6 = (double)(*(code *)(&DAT_001d4310 + *(int *)(&DAT_001d4310 + uVar5 * 4)))(dVar6);
          return dVar6;
        }
        if (uVar1 < 0xc900) {
          return (double)(int)(((uVar1 >> 8) - 0xbf) *
                              *(int *)(&DAT_001f3ed8 + (ulong)(uVar2 & 3) * 4));
        }
        if (0xceff < uVar1) {
          return -123456789.0;
        }
        iVar4 = 0x14 << ((byte)(uVar2 - 0x324 >> 2) & 0x1f);
        iVar3 = (uVar2 & 3) * 2 + 1;
      }
      return (double)iVar3 / (double)iVar4;
    }
    iVar3 = uVar2 - 0x15;
  }
  return (double)iVar3;
}

Assistant:

U_CAPI double U_EXPORT2
u_getNumericValue(UChar32 c) {
    uint32_t props;
    int32_t ntv;
    GET_PROPS(c, props);
    ntv=(int32_t)GET_NUMERIC_TYPE_VALUE(props);

    if(ntv==UPROPS_NTV_NONE) {
        return U_NO_NUMERIC_VALUE;
    } else if(ntv<UPROPS_NTV_DIGIT_START) {
        /* decimal digit */
        return ntv-UPROPS_NTV_DECIMAL_START;
    } else if(ntv<UPROPS_NTV_NUMERIC_START) {
        /* other digit */
        return ntv-UPROPS_NTV_DIGIT_START;
    } else if(ntv<UPROPS_NTV_FRACTION_START) {
        /* small integer */
        return ntv-UPROPS_NTV_NUMERIC_START;
    } else if(ntv<UPROPS_NTV_LARGE_START) {
        /* fraction */
        int32_t numerator=(ntv>>4)-12;
        int32_t denominator=(ntv&0xf)+1;
        return (double)numerator/denominator;
    } else if(ntv<UPROPS_NTV_BASE60_START) {
        /* large, single-significant-digit integer */
        double numValue;
        int32_t mant=(ntv>>5)-14;
        int32_t exp=(ntv&0x1f)+2;
        numValue=mant;

        /* multiply by 10^exp without math.h */
        while(exp>=4) {
            numValue*=10000.;
            exp-=4;
        }
        switch(exp) {
        case 3:
            numValue*=1000.;
            break;
        case 2:
            numValue*=100.;
            break;
        case 1:
            numValue*=10.;
            break;
        case 0:
        default:
            break;
        }

        return numValue;
    } else if(ntv<UPROPS_NTV_FRACTION20_START) {
        /* sexagesimal (base 60) integer */
        int32_t numValue=(ntv>>2)-0xbf;
        int32_t exp=(ntv&3)+1;

        switch(exp) {
        case 4:
            numValue*=60*60*60*60;
            break;
        case 3:
            numValue*=60*60*60;
            break;
        case 2:
            numValue*=60*60;
            break;
        case 1:
            numValue*=60;
            break;
        case 0:
        default:
            break;
        }

        return numValue;
    } else if(ntv<UPROPS_NTV_RESERVED_START) {
        // fraction-20 e.g. 3/80
        int32_t frac20=ntv-UPROPS_NTV_FRACTION20_START;  // 0..0x17
        int32_t numerator=2*(frac20&3)+1;
        int32_t denominator=20<<(frac20>>2);
        return (double)numerator/denominator;
    } else {
        /* reserved */
        return U_NO_NUMERIC_VALUE;
    }
}